

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O0

String * cm::IntoString<char_*>::into_string(String *__return_storage_ptr__,char *s)

{
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *s_local;
  
  local_18 = s;
  s_local = (char *)__return_storage_ptr__;
  if (s == (char *)0x0) {
    memset(__return_storage_ptr__,0,0x20);
    String::String(__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,s,&local_39);
    String::String<std::__cxx11::string,void>(__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

String IntoString<char*>::into_string(const char* s)
{
  if (!s) {
    return String();
  }
  return std::string(s);
}